

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double basym(double *a,double *b,double *lambda,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *eps_local;
  double *lambda_local;
  double *b_local;
  double *a_local;
  
  basym::basym = 0.0;
  if (*a < *b) {
    basym::h = *a / *b;
    basym::r0 = 1.0 / (basym::h + 1.0);
    basym::r1 = (*b - *a) / *b;
    dVar1 = sqrt(*a * (basym::h + 1.0));
  }
  else {
    basym::h = *b / *a;
    basym::r0 = 1.0 / (basym::h + 1.0);
    basym::r1 = (*b - *a) / *a;
    dVar1 = sqrt(*b * (basym::h + 1.0));
  }
  basym::w0 = 1.0 / dVar1;
  basym::T1 = -(*lambda / *a);
  basym::T2 = *lambda / *b;
  dVar1 = *a;
  dVar2 = rlog1(&basym::T1);
  dVar4 = *b;
  dVar3 = rlog1(&basym::T2);
  basym::f = dVar1 * dVar2 + dVar4 * dVar3;
  basym::t = exp(-basym::f);
  if ((basym::t != 0.0) || (NAN(basym::t))) {
    basym::z0 = sqrt(basym::f);
    basym::z = (basym::z0 / basym::e1) * 0.5;
    basym::z2 = basym::f + basym::f;
    basym::a0[0] = basym::r1 * 0.6666666666666666;
    basym::c[0] = -(basym::a0[0] * 0.5);
    basym::d[0] = -basym::c[0];
    dVar1 = 0.5 / basym::e0;
    dVar4 = erfc1(&basym::K3,&basym::z0);
    basym::j0 = dVar1 * dVar4;
    basym::j1 = basym::e1;
    basym::sum = basym::d[0] * basym::w0 * basym::e1 + basym::j0;
    basym::s = 1.0;
    basym::h2 = basym::h * basym::h;
    basym::hn = 1.0;
    basym::w = basym::w0;
    basym::znm1 = basym::z;
    basym::zn = basym::z2;
    for (basym::n = 2; basym::n <= basym::num; basym::n = basym::n + 2) {
      basym::hn = basym::h2 * basym::hn;
      basym::a0[basym::n + -1] =
           (basym::r0 * 2.0 * (basym::h * basym::hn + 1.0)) / ((double)basym::n + 2.0);
      basym::np1 = basym::n + 1;
      basym::s = basym::hn + basym::s;
      basym::a0[basym::n] = (basym::r1 * 2.0 * basym::s) / ((double)basym::n + 3.0);
      for (basym::i = basym::n; basym::i <= basym::np1; basym::i = basym::i + 1) {
        basym::r = -(((double)basym::i + 1.0) * 0.5);
        basym::b0[0] = basym::r * basym::a0[0];
        for (basym::m = 2; basym::m <= basym::i; basym::m = basym::m + 1) {
          basym::bsum = 0.0;
          basym::mm1 = basym::m + -1;
          for (basym::j = 1; basym::j <= basym::mm1; basym::j = basym::j + 1) {
            basym::mmj = basym::m - basym::j;
            basym::bsum = ((double)basym::j * basym::r + -(double)basym::mmj) *
                          basym::a0[basym::j + -1] * basym::b0[basym::mmj + -1] + basym::bsum;
          }
          basym::b0[basym::m + -1] =
               basym::r * basym::a0[basym::m + -1] + basym::bsum / (double)basym::m;
        }
        basym::c[basym::i + -1] = basym::b0[basym::i + -1] / ((double)basym::i + 1.0);
        basym::dsum = 0.0;
        basym::im1 = basym::i + -1;
        for (basym::j = 1; basym::j <= basym::im1; basym::j = basym::j + 1) {
          basym::imj = basym::i - basym::j;
          basym::dsum = basym::d[basym::imj + -1] * basym::c[basym::j + -1] + basym::dsum;
        }
        basym::d[basym::i + -1] = -(basym::dsum + basym::c[basym::i + -1]);
      }
      basym::j0 = basym::e1 * basym::znm1 + ((double)basym::n - 1.0) * basym::j0;
      basym::j1 = basym::e1 * basym::zn + (double)basym::n * basym::j1;
      basym::znm1 = basym::z2 * basym::znm1;
      basym::zn = basym::z2 * basym::zn;
      basym::t0 = basym::d[basym::n + -1] * basym::w0 * basym::w * basym::j0;
      basym::w = basym::w0 * basym::w0 * basym::w;
      basym::t1 = basym::d[basym::np1 + -1] * basym::w * basym::j1;
      basym::sum = basym::t0 + basym::t1 + basym::sum;
      if (ABS(basym::t0) + ABS(basym::t1) <= *eps * basym::sum) break;
    }
    dVar1 = bcorr(a,b);
    basym::u = exp(-dVar1);
    basym::basym = basym::e0 * basym::t * basym::u * basym::sum;
  }
  return basym::basym;
}

Assistant:

double basym(double *a,double *b,double *lambda,double *eps)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) FOR LARGE A AND B.
     LAMBDA = (A + B)*Y - B  AND EPS IS THE TOLERANCE USED.
     IT IS ASSUMED THAT LAMBDA IS NONNEGATIVE AND THAT
     A AND B ARE GREATER THAN OR EQUAL TO 15.
-----------------------------------------------------------------------
*/
{
static double e0 = 1.12837916709551e0;
static double e1 = .353553390593274e0;
static int num = 20;
/*
------------------------
     ****** NUM IS THE MAXIMUM VALUE THAT N CAN TAKE IN THE DO LOOP
            ENDING AT STATEMENT 50. IT IS REQUIRED THAT NUM BE EVEN.
            THE ARRAYS A0, B0, C, D HAVE DIMENSION NUM + 1.
------------------------
     E0 = 2/SQRT(PI)
     E1 = 2**(-3/2)
------------------------
*/
static int K3 = 1;
static double basym,bsum,dsum,f,h,h2,hn,j0,j1,r,r0,r1,s,sum,t,t0,t1,u,w,w0,z,z0,
    z2,zn,znm1;
static int i,im1,imj,j,m,mm1,mmj,n,np1;
static double a0[21],b0[21],c[21],d[21],T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    basym = 0.0e0;
    if(*a >= *b) goto S10;
    h = *a/ *b;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *b;
    w0 = 1.0e0/sqrt(*a*(1.0e0+h));
    goto S20;
S10:
    h = *b/ *a;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *a;
    w0 = 1.0e0/sqrt(*b*(1.0e0+h));
S20:
    T1 = -(*lambda/ *a);
    T2 = *lambda/ *b;
    f = *a*rlog1(&T1)+*b*rlog1(&T2);
    t = exp(-f);
    if(t == 0.0e0) return basym;
    z0 = sqrt(f);
    z = 0.5e0*(z0/e1);
    z2 = f+f;
    a0[0] = 2.0e0/3.0e0*r1;
    c[0] = -(0.5e0*a0[0]);
    d[0] = -c[0];
    j0 = 0.5e0/e0*erfc1(&K3,&z0);
    j1 = e1;
    sum = j0+d[0]*w0*j1;
    s = 1.0e0;
    h2 = h*h;
    hn = 1.0e0;
    w = w0;
    znm1 = z;
    zn = z2;
    for(n=2; n<=num; n+=2) {
        hn = h2*hn;
        a0[n-1] = 2.0e0*r0*(1.0e0+h*hn)/((double)n+2.0e0);
        np1 = n+1;
        s += hn;
        a0[np1-1] = 2.0e0*r1*s/((double)n+3.0e0);
        for(i=n; i<=np1; i++) {
            r = -(0.5e0*((double)i+1.0e0));
            b0[0] = r*a0[0];
            for(m=2; m<=i; m++) {
                bsum = 0.0e0;
                mm1 = m-1;
                for(j=1; j<=mm1; j++) {
                    mmj = m-j;
                    bsum += (((double)j*r-(double)mmj)*a0[j-1]*b0[mmj-1]);
                }
                b0[m-1] = r*a0[m-1]+bsum/(double)m;
            }
            c[i-1] = b0[i-1]/((double)i+1.0e0);
            dsum = 0.0e0;
            im1 = i-1;
            for(j=1; j<=im1; j++) {
                imj = i-j;
                dsum += (d[imj-1]*c[j-1]);
            }
            d[i-1] = -(dsum+c[i-1]);
        }
        j0 = e1*znm1+((double)n-1.0e0)*j0;
        j1 = e1*zn+(double)n*j1;
        znm1 = z2*znm1;
        zn = z2*zn;
        w = w0*w;
        t0 = d[n-1]*w*j0;
        w = w0*w;
        t1 = d[np1-1]*w*j1;
        sum += (t0+t1);
        if(fabs(t0)+fabs(t1) <= *eps*sum) goto S80;
    }
S80:
    u = exp(-bcorr(a,b));
    basym = e0*t*u*sum;
    return basym;
}